

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
StringEqualFailure::StringEqualFailure
          (StringEqualFailure *this,UtestShell *test,char *fileName,int lineNumber,char *expected,
          char *actual,SimpleString *text)

{
  SimpleString *in_RDI;
  long in_R8;
  TestFailure *in_R9;
  size_t failStart;
  DifferenceFormat in_stack_00000034;
  size_t in_stack_00000038;
  SimpleString *in_stack_00000040;
  TestFailure *in_stack_00000048;
  SimpleString *in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  TestFailure *in_stack_ffffffffffffff98;
  long lVar1;
  SimpleString *in_stack_ffffffffffffffa0;
  TestFailure *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  UtestShell *in_stack_ffffffffffffffc8;
  
  TestFailure::TestFailure
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  in_RDI->buffer_ = (char *)&PTR__StringEqualFailure_0025dcf8;
  TestFailure::createUserText(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  SimpleString::operator=(in_RDI,in_stack_ffffffffffffff78);
  SimpleString::~SimpleString((SimpleString *)0x212621);
  StringFromOrNull((char *)in_stack_ffffffffffffff88);
  StringFromOrNull((char *)in_stack_ffffffffffffff88);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff78);
  SimpleString::~SimpleString((SimpleString *)0x21267d);
  SimpleString::~SimpleString((SimpleString *)0x212687);
  SimpleString::~SimpleString((SimpleString *)0x212691);
  if ((in_R8 != 0) && (in_R9 != (TestFailure *)0x0)) {
    for (lVar1 = 0; *(char *)((long)&in_R9->_vptr_TestFailure + lVar1) == *(char *)(in_R8 + lVar1);
        lVar1 = lVar1 + 1) {
    }
    SimpleString::SimpleString(in_RDI,(char *)in_stack_ffffffffffffff78);
    TestFailure::createDifferenceAtPosString
              (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000034);
    SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff78);
    SimpleString::~SimpleString((SimpleString *)0x2127b7);
    SimpleString::~SimpleString((SimpleString *)0x2127c1);
  }
  return;
}

Assistant:

StringEqualFailure::StringEqualFailure(UtestShell* test, const char* fileName, int lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
            ;
        message_ += createDifferenceAtPosString(actual, failStart);
    }
}